

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_HTMLparser(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  htmlDocPtr pxVar21;
  size_t sVar22;
  ulong uVar23;
  htmlParserCtxtPtr pxVar24;
  xmlDocPtr pxVar25;
  long lVar26;
  undefined8 uVar27;
  ulong uVar28;
  undefined8 uVar29;
  int n_options;
  uint uVar30;
  ulong *puVar31;
  uint *puVar32;
  int n_inlen;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  undefined *puVar36;
  char *pcVar37;
  int test_ret_11;
  uint uVar38;
  int iVar39;
  undefined4 uVar40;
  undefined8 uVar41;
  int test_ret_14;
  uint uVar42;
  undefined4 *puVar43;
  char *pcVar44;
  ulong uVar45;
  undefined8 *puVar46;
  int test_ret_8;
  int *piVar47;
  int n_name;
  uint uVar48;
  bool bVar49;
  int test_ret_1;
  int test_ret;
  int test_ret_18;
  int test_ret_10;
  int test_ret_3;
  int test_ret_2;
  int test_ret_16;
  int test_ret_4;
  int test_ret_5;
  int local_84;
  int local_80;
  int local_68;
  int local_64;
  uint local_60;
  int local_58;
  int local_3c;
  undefined8 *local_38;
  
  if (quiet == '\0') {
    puts("Testing HTMLparser : 32 of 38 functions ...");
  }
  iVar1 = 0;
  uVar48 = 0;
  do {
    uVar41 = 0;
    if (uVar48 == 0) {
      uVar41 = 0x168a14;
    }
    iVar33 = 0;
    do {
      iVar2 = xmlMemBlocks();
      uVar27 = 0;
      if (iVar33 == 0) {
        uVar27 = 0x168a1c;
      }
      UTF8ToHtml(0,uVar41,0,uVar27);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in UTF8ToHtml",(ulong)(uint)(iVar3 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar48);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      iVar33 = iVar33 + 1;
    } while (iVar33 == 1);
    bVar49 = uVar48 == 0;
    uVar48 = uVar48 + 1;
  } while (bVar49);
  function_tests = function_tests + 1;
  local_84 = 0;
  uVar48 = 0;
  do {
    puVar43 = &DAT_00163454;
    uVar23 = 0;
    do {
      iVar33 = xmlMemBlocks();
      if (uVar48 < 4) {
        uVar28 = (&DAT_00165d70)[uVar48];
      }
      else {
        uVar28 = 0;
      }
      uVar40 = 0xffffffff;
      uVar34 = (uint)uVar23;
      if (uVar34 < 4) {
        uVar40 = *puVar43;
      }
      htmlAttrAllowed(0,uVar28,uVar40);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar33 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlAttrAllowed",(ulong)(uint)(iVar2 - iVar33));
        local_84 = local_84 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        putchar(10);
        uVar28 = uVar23;
      }
      uVar34 = uVar34 + 1;
      uVar23 = (ulong)uVar34;
      puVar43 = puVar43 + 1;
    } while (uVar34 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar48 = 0;
  do {
    puVar31 = &DAT_00165d70;
    uVar34 = 0;
    do {
      iVar2 = (int)uVar28;
      iVar33 = xmlMemBlocks();
      pxVar21 = gen_htmlDocPtr(uVar48,iVar2);
      if (uVar34 < 4) {
        uVar28 = *puVar31;
      }
      else {
        uVar28 = 0;
      }
      htmlAutoCloseTag(pxVar21,uVar28,0);
      call_tests = call_tests + 1;
      if (((pxVar21 != (htmlDocPtr)0x0) && (api_doc != pxVar21)) && (pxVar21->doc != api_doc)) {
        xmlFreeDoc(pxVar21);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar33 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlAutoCloseTag",(ulong)(uint)(iVar2 - iVar33));
        local_64 = local_64 + 1;
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        uVar28 = 0;
        printf(" %d");
        putchar(10);
      }
      uVar34 = uVar34 + 1;
      puVar31 = puVar31 + 1;
    } while (uVar34 != 5);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  local_68 = 0;
  uVar48 = 0;
  do {
    piVar47 = &DAT_00163454;
    uVar34 = 0;
    do {
      iVar33 = xmlMemBlocks();
      if (uVar48 == 0) {
        bVar49 = false;
        pcVar44 = "foo";
      }
      else if (uVar48 == 2) {
        bVar49 = false;
        pcVar44 = "test/ent2";
      }
      else if (uVar48 == 1) {
        bVar49 = false;
        pcVar44 = "<foo/>";
      }
      else {
        bVar49 = true;
        pcVar44 = (char *)0x0;
      }
      iVar2 = -1;
      if (uVar34 < 4) {
        iVar2 = *piVar47;
      }
      if ((bVar49) || (sVar22 = strlen(pcVar44), iVar2 <= (int)sVar22 + 1)) {
        lVar26 = htmlCreateMemoryParserCtxt(pcVar44,iVar2);
        if (lVar26 != 0) {
          htmlFreeParserCtxt(lVar26);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar33 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlCreateMemoryParserCtxt",
                 (ulong)(uint)(iVar2 - iVar33));
          local_68 = local_68 + 1;
          printf(" %d",(ulong)uVar48);
          printf(" %d",(ulong)uVar34);
          putchar(10);
        }
      }
      uVar34 = uVar34 + 1;
      piVar47 = piVar47 + 1;
    } while (uVar34 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 4);
  function_tests = function_tests + 1;
  iVar33 = 0;
  iVar2 = 0;
  do {
    iVar3 = 0;
    do {
      uVar48 = 0;
      do {
        uVar23 = 0;
        do {
          piVar47 = (int *)0x0;
          do {
            iVar5 = (int)piVar47;
            iVar4 = xmlMemBlocks();
            pcVar44 = (char *)&call_tests;
            if (iVar2 != 0) {
              if (iVar2 == 1) {
                pcVar44 = (char *)0xffffffffffffffff;
              }
              else {
                pcVar44 = (char *)0x0;
              }
            }
            if (iVar3 == 0) {
              bVar49 = false;
              pcVar37 = "foo";
            }
            else if (iVar3 == 2) {
              bVar49 = false;
              pcVar37 = "test/ent2";
            }
            else if (iVar3 == 1) {
              bVar49 = false;
              pcVar37 = "<foo/>";
            }
            else {
              bVar49 = true;
              pcVar37 = (char *)0x0;
            }
            iVar39 = -1;
            if (uVar48 < 4) {
              iVar39 = (&DAT_00163454)[uVar48];
            }
            if ((uint)uVar23 < 5) {
              puVar36 = (&PTR_anon_var_dwarf_65b_00165d30)[uVar23];
            }
            else {
              puVar36 = (undefined *)0x0;
            }
            if ((bVar49) || (sVar22 = strlen(pcVar37), iVar39 <= (int)sVar22 + 1)) {
              lVar26 = htmlCreatePushParserCtxt(0,pcVar44,pcVar37,iVar39,puVar36);
              if (lVar26 != 0) {
                htmlFreeParserCtxt();
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar39 = xmlMemBlocks();
              if (iVar4 != iVar39) {
                iVar39 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlCreatePushParserCtxt",
                       (ulong)(uint)(iVar39 - iVar4));
                iVar33 = iVar33 + 1;
                printf(" %d",0);
                printf(" %d",iVar2);
                printf(" %d",iVar3);
                printf(" %d",(ulong)uVar48);
                printf(" %d",uVar23);
                printf(" %d");
                putchar(10);
                pcVar44 = (char *)piVar47;
              }
            }
            uVar34 = iVar5 + 1;
            piVar47 = (int *)(ulong)uVar34;
          } while (uVar34 != 4);
          uVar34 = (uint)uVar23 + 1;
          uVar23 = (ulong)uVar34;
        } while (uVar34 != 6);
        uVar48 = uVar48 + 1;
      } while (uVar48 != 4);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 4);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  function_tests = function_tests + 1;
  local_38 = &DAT_00165d70;
  local_3c = 0;
  uVar48 = 0;
  do {
    uVar34 = 0;
    do {
      uVar38 = 0;
      do {
        uVar42 = 0;
        do {
          uVar30 = 0;
          puVar43 = &DAT_00163454;
          do {
            iVar3 = (int)pcVar44;
            iVar2 = xmlMemBlocks();
            pxVar24 = gen_htmlParserCtxtPtr(uVar48,iVar3);
            if (uVar34 < 4) {
              pcVar44 = (char *)(&DAT_00165d70)[uVar34];
            }
            else {
              pcVar44 = (char *)0x0;
            }
            if (uVar38 < 7) {
              uVar41 = (&DAT_00165d90)[uVar38];
            }
            else {
              uVar41 = 0;
            }
            if (uVar42 < 3) {
              uVar27 = (&DAT_00165d58)[uVar42];
            }
            else {
              uVar27 = 0;
            }
            uVar40 = 0xffffffff;
            if (uVar30 < 4) {
              uVar40 = *puVar43;
            }
            pxVar25 = (xmlDocPtr)htmlCtxtReadDoc(pxVar24,pcVar44,uVar41,uVar27,uVar40);
            if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc))
            {
              xmlFreeDoc(pxVar25);
            }
            call_tests = call_tests + 1;
            if (pxVar24 != (htmlParserCtxtPtr)0x0) {
              htmlFreeParserCtxt(pxVar24);
            }
            xmlResetLastError();
            iVar3 = xmlMemBlocks();
            if (iVar2 != iVar3) {
              iVar3 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCtxtReadDoc",(ulong)(uint)(iVar3 - iVar2));
              local_3c = local_3c + 1;
              printf(" %d",(ulong)uVar48);
              printf(" %d",(ulong)uVar34);
              printf(" %d",(ulong)uVar38);
              printf(" %d",(ulong)uVar42);
              pcVar44 = (char *)(ulong)uVar30;
              printf(" %d");
              putchar(10);
            }
            uVar30 = uVar30 + 1;
            puVar43 = puVar43 + 1;
          } while (uVar30 != 4);
          uVar42 = uVar42 + 1;
        } while (uVar42 != 4);
        uVar38 = uVar38 + 1;
      } while (uVar38 != 8);
      uVar34 = uVar34 + 1;
    } while (uVar34 != 5);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  iVar1 = local_84 + iVar1 + local_64 + local_68;
  iVar2 = 0;
  do {
    uVar48 = 0;
    do {
      uVar34 = 0;
      do {
        puVar43 = &DAT_00163454;
        uVar38 = 0;
        do {
          pxVar24 = gen_htmlParserCtxtPtr(iVar2,(int)pcVar44);
          if (uVar48 < 7) {
            pcVar44 = (char *)(&DAT_00165d90)[uVar48];
          }
          else {
            pcVar44 = (char *)0x0;
          }
          if (uVar34 < 3) {
            uVar41 = (&DAT_00165d58)[uVar34];
          }
          else {
            uVar41 = 0;
          }
          uVar40 = 0xffffffff;
          if (uVar38 < 4) {
            uVar40 = *puVar43;
          }
          pxVar25 = (xmlDocPtr)htmlCtxtReadFile(pxVar24,pcVar44,uVar41,uVar40);
          if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)) {
            xmlFreeDoc(pxVar25);
          }
          call_tests = call_tests + 1;
          if (pxVar24 != (htmlParserCtxtPtr)0x0) {
            htmlFreeParserCtxt(pxVar24);
          }
          xmlResetLastError();
          uVar38 = uVar38 + 1;
          puVar43 = puVar43 + 1;
        } while (uVar38 != 4);
        uVar34 = uVar34 + 1;
      } while (uVar34 != 4);
      uVar48 = uVar48 + 1;
    } while (uVar48 != 8);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  function_tests = function_tests + 1;
  local_68 = 0;
  uVar48 = 0;
  do {
    iVar2 = 0;
    do {
      uVar34 = 0;
      do {
        uVar38 = 0;
        do {
          uVar42 = 0;
          do {
            piVar47 = (int *)0x0;
            do {
              iVar4 = (int)pcVar44;
              iVar3 = xmlMemBlocks();
              pxVar24 = gen_htmlParserCtxtPtr(uVar48,iVar4);
              if (iVar2 == 0) {
                bVar49 = false;
                pcVar44 = "foo";
              }
              else if (iVar2 == 2) {
                bVar49 = false;
                pcVar44 = "test/ent2";
              }
              else if (iVar2 == 1) {
                bVar49 = false;
                pcVar44 = "<foo/>";
              }
              else {
                bVar49 = true;
                pcVar44 = (char *)0x0;
              }
              iVar4 = -1;
              if (uVar34 < 4) {
                iVar4 = (&DAT_00163454)[uVar34];
              }
              iVar5 = (int)piVar47;
              if ((bVar49) || (sVar22 = strlen(pcVar44), iVar4 <= (int)sVar22 + 1)) {
                pxVar25 = (xmlDocPtr)htmlCtxtReadMemory();
                if ((pxVar25 != (xmlDocPtr)0x0) &&
                   ((api_doc != pxVar25 && (pxVar25->doc != api_doc)))) {
                  xmlFreeDoc(pxVar25);
                }
                call_tests = call_tests + 1;
                if (pxVar24 != (htmlParserCtxtPtr)0x0) {
                  htmlFreeParserCtxt(pxVar24);
                }
                xmlResetLastError();
                iVar4 = xmlMemBlocks();
                if (iVar3 != iVar4) {
                  iVar4 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlCtxtReadMemory",
                         (ulong)(uint)(iVar4 - iVar3));
                  local_68 = local_68 + 1;
                  printf(" %d",(ulong)uVar48);
                  printf(" %d",iVar2);
                  printf(" %d",(ulong)uVar34);
                  printf(" %d",(ulong)uVar38);
                  printf(" %d",(ulong)uVar42);
                  printf(" %d");
                  putchar(10);
                  pcVar44 = (char *)piVar47;
                }
              }
              uVar30 = iVar5 + 1;
              piVar47 = (int *)(ulong)uVar30;
            } while (uVar30 != 4);
            uVar42 = uVar42 + 1;
          } while (uVar42 != 4);
          uVar38 = uVar38 + 1;
        } while (uVar38 != 8);
        uVar34 = uVar34 + 1;
      } while (uVar34 != 4);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  uVar48 = 0;
  local_80 = 0;
  do {
    iVar2 = xmlMemBlocks();
    pxVar24 = gen_htmlParserCtxtPtr(uVar48,(int)pcVar44);
    htmlCtxtReset(pxVar24);
    call_tests = call_tests + 1;
    if (pxVar24 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar24);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtReset",(ulong)(uint)(iVar3 - iVar2));
      local_80 = local_80 + 1;
      pcVar44 = (char *)(ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar48 = 0;
  do {
    puVar32 = &DAT_00163454;
    piVar47 = (int *)0x0;
    do {
      iVar4 = (int)pcVar44;
      iVar3 = xmlMemBlocks();
      pxVar24 = gen_htmlParserCtxtPtr(uVar48,iVar4);
      pcVar44 = (char *)0xffffffff;
      uVar34 = (uint)piVar47;
      if (uVar34 < 4) {
        pcVar44 = (char *)(ulong)*puVar32;
      }
      htmlCtxtUseOptions(pxVar24);
      call_tests = call_tests + 1;
      if (pxVar24 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt(pxVar24);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtUseOptions",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        putchar(10);
        pcVar44 = (char *)piVar47;
      }
      uVar34 = uVar34 + 1;
      piVar47 = (int *)(ulong)uVar34;
      puVar32 = puVar32 + 1;
    } while (uVar34 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  uVar48 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar48 < 4) {
      uVar41 = *local_38;
    }
    else {
      uVar41 = 0;
    }
    htmlElementAllowedHere(0,uVar41);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlElementAllowedHere",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    local_38 = local_38 + 1;
  } while (uVar48 != 5);
  iVar1 = iVar1 + iVar33 + local_3c + local_68 + local_80;
  function_tests = function_tests + 1;
  iVar33 = xmlMemBlocks();
  htmlElementStatusHere(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar33 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlElementStatusHere",(ulong)(uint)(iVar5 - iVar33));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar23 = 0;
  do {
    uVar28 = 0;
    iVar39 = (int)uVar23;
    uVar45 = 0;
    if (iVar39 == 0) {
      uVar45 = 0x168a14;
    }
    do {
      iVar8 = (int)uVar28;
      uVar41 = 0;
      if (iVar8 == 0) {
        uVar41 = 0x168a1c;
      }
      puVar43 = &DAT_00163454;
      uVar48 = 0;
      do {
        iVar6 = xmlMemBlocks();
        uVar40 = 0xffffffff;
        if (uVar48 < 4) {
          uVar40 = *puVar43;
        }
        uVar35 = uVar45;
        htmlEncodeEntities(0,uVar45,0,uVar41,uVar40);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlEncodeEntities",(ulong)(uint)(iVar7 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",0);
          printf(" %d",uVar23);
          printf(" %d",0);
          printf(" %d",uVar28);
          uVar35 = (ulong)uVar48;
          printf(" %d");
          putchar(10);
        }
        uVar48 = uVar48 + 1;
        puVar43 = puVar43 + 1;
      } while (uVar48 != 4);
      uVar28 = (ulong)(iVar8 + 1);
    } while (iVar8 == 0);
    uVar23 = (ulong)(iVar39 + 1);
  } while (iVar39 == 0);
  function_tests = function_tests + 1;
  puVar46 = &DAT_00165d70;
  uVar48 = 0;
  iVar39 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar48 < 4) {
      uVar41 = *puVar46;
    }
    else {
      uVar41 = 0;
    }
    htmlEntityLookup(uVar41);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar8 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityLookup",(ulong)(uint)(iVar6 - iVar8));
      iVar39 = iVar39 + 1;
      uVar35 = (ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar46 = puVar46 + 1;
  } while (uVar48 != 5);
  local_60 = (uint)(iVar33 != iVar4);
  function_tests = function_tests + 1;
  puVar43 = &DAT_001551ec;
  uVar48 = 0;
  iVar33 = 0;
  do {
    iVar4 = xmlMemBlocks();
    uVar40 = 0xffffffff;
    if (uVar48 < 3) {
      uVar40 = *puVar43;
    }
    htmlEntityValueLookup(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar4 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityValueLookup",(ulong)(uint)(iVar8 - iVar4));
      iVar33 = iVar33 + 1;
      uVar35 = (ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar43 = puVar43 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  puVar43 = &DAT_00163454;
  uVar48 = 0;
  iVar4 = 0;
  do {
    iVar8 = xmlMemBlocks();
    uVar40 = 0xffffffff;
    if (uVar48 < 4) {
      uVar40 = *puVar43;
    }
    htmlHandleOmittedElem(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar8 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlHandleOmittedElem",(ulong)(uint)(iVar6 - iVar8));
      iVar4 = iVar4 + 1;
      uVar35 = (ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar43 = puVar43 + 1;
  } while (uVar48 != 4);
  function_tests = function_tests + 1;
  iVar6 = 0;
  iVar8 = 0;
  do {
    iVar9 = (int)uVar35;
    iVar7 = xmlMemBlocks();
    pxVar21 = gen_htmlDocPtr(iVar8,iVar9);
    uVar35 = 0;
    htmlIsAutoClosed(pxVar21);
    call_tests = call_tests + 1;
    if (((pxVar21 != (htmlDocPtr)0x0) && (api_doc != pxVar21)) && (pxVar21->doc != api_doc)) {
      xmlFreeDoc(pxVar21);
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar7 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsAutoClosed",(ulong)(uint)(iVar9 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d");
      uVar35 = 0;
      printf(" %d");
      putchar(10);
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 3);
  function_tests = function_tests + 1;
  puVar46 = &DAT_00165d70;
  uVar48 = 0;
  iVar8 = 0;
  do {
    iVar7 = xmlMemBlocks();
    if (uVar48 < 4) {
      uVar41 = *puVar46;
    }
    else {
      uVar41 = 0;
    }
    htmlIsScriptAttribute(uVar41);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar7 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsScriptAttribute",(ulong)(uint)(iVar9 - iVar7));
      iVar8 = iVar8 + 1;
      printf(" %d",(ulong)uVar48);
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar46 = puVar46 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  lVar26 = htmlNewParserCtxt();
  if (lVar26 != 0) {
    htmlFreeParserCtxt(lVar26);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar7 != iVar9) {
    iVar10 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlNewParserCtxt",(ulong)(uint)(iVar10 - iVar7));
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar32 = &DAT_00163454;
  uVar48 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    pcVar44 = (char *)0xffffffff;
    if (uVar48 < 4) {
      pcVar44 = (char *)(ulong)*puVar32;
    }
    htmlNodeStatus(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlNodeStatus",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d",0);
      pcVar44 = (char *)(ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar32 = puVar32 + 1;
  } while (uVar48 != 4);
  function_tests = function_tests + 1;
  uVar48 = 0;
  iVar11 = 0;
  do {
    iVar12 = xmlMemBlocks();
    pxVar24 = gen_htmlParserCtxtPtr(uVar48,(int)pcVar44);
    htmlParseCharRef(pxVar24);
    call_tests = call_tests + 1;
    if (pxVar24 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar24);
    }
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseCharRef",(ulong)(uint)(iVar13 - iVar12));
      iVar11 = iVar11 + 1;
      pcVar44 = (char *)(ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  local_58 = 0;
  uVar48 = 0;
  do {
    iVar12 = 0;
    do {
      uVar34 = 0;
      do {
        puVar43 = &DAT_00163454;
        uVar38 = 0;
        do {
          iVar13 = xmlMemBlocks();
          pxVar24 = gen_htmlParserCtxtPtr(uVar48,(int)pcVar44);
          if (iVar12 == 0) {
            bVar49 = false;
            pcVar37 = "foo";
          }
          else if (iVar12 == 2) {
            bVar49 = false;
            pcVar37 = "test/ent2";
          }
          else if (iVar12 == 1) {
            bVar49 = false;
            pcVar37 = "<foo/>";
          }
          else {
            bVar49 = true;
            pcVar37 = (char *)0x0;
          }
          uVar40 = 0xffffffff;
          iVar14 = -1;
          if (uVar34 < 4) {
            iVar14 = (&DAT_00163454)[uVar34];
          }
          if (uVar38 < 4) {
            uVar40 = *puVar43;
          }
          if ((bVar49) || (sVar22 = strlen(pcVar37), iVar14 <= (int)sVar22 + 1)) {
            htmlParseChunk(pxVar24,pcVar37,iVar14,uVar40);
            if (pxVar24 == (htmlParserCtxtPtr)0x0) {
              call_tests = call_tests + 1;
              pcVar44 = pcVar37;
            }
            else {
              xmlFreeDoc(pxVar24->myDoc);
              pxVar24->myDoc = (xmlDocPtr)0x0;
              call_tests = call_tests + 1;
              htmlFreeParserCtxt(pxVar24);
              pcVar44 = pcVar37;
            }
            xmlResetLastError();
            iVar14 = xmlMemBlocks();
            if (iVar13 != iVar14) {
              iVar14 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlParseChunk",(ulong)(uint)(iVar14 - iVar13));
              local_58 = local_58 + 1;
              printf(" %d",(ulong)uVar48);
              printf(" %d",iVar12);
              printf(" %d",(ulong)uVar34);
              pcVar44 = (char *)(ulong)uVar38;
              printf(" %d");
              putchar(10);
            }
          }
          uVar38 = uVar38 + 1;
          puVar43 = puVar43 + 1;
        } while (uVar38 != 4);
        uVar34 = uVar34 + 1;
      } while (uVar34 != 4);
      iVar12 = iVar12 + 1;
    } while (iVar12 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar48 = 0;
  do {
    puVar31 = &DAT_00165d58;
    uVar34 = 0;
    do {
      iVar13 = xmlMemBlocks();
      if (uVar48 < 4) {
        uVar41 = (&DAT_00165d70)[uVar48];
      }
      else {
        uVar41 = 0;
      }
      if (uVar34 < 3) {
        uVar23 = *puVar31;
      }
      else {
        uVar23 = 0;
      }
      pxVar25 = (xmlDocPtr)htmlParseDoc(uVar41);
      if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar13 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlParseDoc",(ulong)(uint)(iVar14 - iVar13));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar48);
        uVar23 = (ulong)uVar34;
        printf(" %d");
        putchar(10);
      }
      uVar34 = uVar34 + 1;
      puVar31 = puVar31 + 1;
    } while (uVar34 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  uVar48 = 0;
  iVar13 = 0;
  do {
    iVar14 = xmlMemBlocks();
    pxVar24 = gen_htmlParserCtxtPtr(uVar48,(int)uVar23);
    htmlParseDocument(pxVar24);
    if (pxVar24 == (htmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar24->myDoc);
      pxVar24->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      htmlFreeParserCtxt(pxVar24);
    }
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseDocument",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      uVar23 = (ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  uVar48 = 0;
  iVar14 = 0;
  do {
    iVar15 = xmlMemBlocks();
    pxVar24 = gen_htmlParserCtxtPtr(uVar48,(int)uVar23);
    htmlParseElement(pxVar24);
    call_tests = call_tests + 1;
    if (pxVar24 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar24);
    }
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseElement",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      uVar23 = (ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  local_80 = 0;
  iVar15 = 0;
  do {
    iVar17 = (int)uVar23;
    iVar16 = xmlMemBlocks();
    pxVar24 = gen_htmlParserCtxtPtr(iVar15,iVar17);
    uVar23 = 0;
    htmlParseEntityRef();
    call_tests = call_tests + 1;
    if (pxVar24 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar16 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseEntityRef",(ulong)(uint)(iVar17 - iVar16));
      local_80 = local_80 + 1;
      printf(" %d");
      uVar23 = 0;
      printf(" %d");
      putchar(10);
    }
    iVar15 = iVar15 + 1;
  } while (iVar15 != 3);
  function_tests = function_tests + 1;
  uVar48 = 0;
  do {
    puVar46 = &DAT_00165d58;
    uVar34 = 0;
    do {
      if (uVar48 < 7) {
        uVar41 = (&DAT_00165d90)[uVar48];
      }
      else {
        uVar41 = 0;
      }
      if (uVar34 < 3) {
        uVar27 = *puVar46;
      }
      else {
        uVar27 = 0;
      }
      pxVar25 = (xmlDocPtr)htmlParseFile(uVar41,uVar27);
      if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      uVar34 = uVar34 + 1;
      puVar46 = puVar46 + 1;
    } while (uVar34 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 8);
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar48 = 0;
  do {
    uVar23 = 0;
    do {
      uVar28 = 0;
      do {
        puVar43 = &DAT_00163454;
        uVar34 = 0;
        do {
          iVar15 = xmlMemBlocks();
          if (uVar48 < 4) {
            uVar41 = (&DAT_00165d70)[uVar48];
          }
          else {
            uVar41 = 0;
          }
          if ((uint)uVar23 < 7) {
            uVar27 = (&DAT_00165d90)[uVar23];
          }
          else {
            uVar27 = 0;
          }
          if ((uint)uVar28 < 3) {
            uVar29 = (&DAT_00165d58)[uVar28];
          }
          else {
            uVar29 = 0;
          }
          uVar40 = 0xffffffff;
          if (uVar34 < 4) {
            uVar40 = *puVar43;
          }
          pxVar25 = (xmlDocPtr)htmlReadDoc(uVar41,uVar27,uVar29,uVar40);
          if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)) {
            xmlFreeDoc();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar16 = xmlMemBlocks();
          if (iVar15 != iVar16) {
            iVar16 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlReadDoc",(ulong)(uint)(iVar16 - iVar15));
            local_64 = local_64 + 1;
            printf(" %d",(ulong)uVar48);
            printf(" %d",uVar23);
            printf(" %d",uVar28);
            printf(" %d");
            putchar(10);
          }
          uVar34 = uVar34 + 1;
          puVar43 = puVar43 + 1;
        } while (uVar34 != 4);
        uVar34 = (uint)uVar28 + 1;
        uVar28 = (ulong)uVar34;
      } while (uVar34 != 4);
      uVar34 = (uint)uVar23 + 1;
      uVar23 = (ulong)uVar34;
    } while (uVar34 != 8);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  local_68 = 0;
  uVar48 = 0;
  do {
    uVar23 = 0;
    do {
      uVar34 = 0;
      puVar43 = &DAT_00163454;
      do {
        iVar15 = xmlMemBlocks();
        if (uVar48 < 7) {
          uVar41 = (&DAT_00165d90)[uVar48];
        }
        else {
          uVar41 = 0;
        }
        if ((uint)uVar23 < 3) {
          uVar27 = (&DAT_00165d58)[uVar23];
        }
        else {
          uVar27 = 0;
        }
        uVar40 = 0xffffffff;
        if (uVar34 < 4) {
          uVar40 = *puVar43;
        }
        pxVar25 = (xmlDocPtr)htmlReadFile(uVar41,uVar27,uVar40);
        if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar16 = xmlMemBlocks();
        if (iVar15 != iVar16) {
          iVar16 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlReadFile",(ulong)(uint)(iVar16 - iVar15));
          local_68 = local_68 + 1;
          printf(" %d",(ulong)uVar48);
          printf(" %d",uVar23);
          printf(" %d");
          putchar(10);
        }
        uVar34 = uVar34 + 1;
        puVar43 = puVar43 + 1;
      } while (uVar34 != 4);
      uVar34 = (uint)uVar23 + 1;
      uVar23 = (ulong)uVar34;
    } while (uVar34 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 8);
  function_tests = function_tests + 1;
  iVar15 = 0;
  iVar16 = 0;
  do {
    uVar48 = 0;
    do {
      uVar23 = 0;
      do {
        uVar34 = 0;
        do {
          uVar28 = 0;
          puVar43 = &DAT_00163454;
          do {
            iVar17 = xmlMemBlocks();
            if (iVar16 == 0) {
              bVar49 = false;
              pcVar44 = "foo";
            }
            else if (iVar16 == 2) {
              bVar49 = false;
              pcVar44 = "test/ent2";
            }
            else if (iVar16 == 1) {
              bVar49 = false;
              pcVar44 = "<foo/>";
            }
            else {
              bVar49 = true;
              pcVar44 = (char *)0x0;
            }
            iVar18 = -1;
            if (uVar48 < 4) {
              iVar18 = (&DAT_00163454)[uVar48];
            }
            if ((uint)uVar23 < 7) {
              uVar41 = (&DAT_00165d90)[uVar23];
            }
            else {
              uVar41 = 0;
            }
            if (uVar34 < 3) {
              uVar27 = (&DAT_00165d58)[uVar34];
            }
            else {
              uVar27 = 0;
            }
            uVar40 = 0xffffffff;
            if ((uint)uVar28 < 4) {
              uVar40 = *puVar43;
            }
            if ((bVar49) || (sVar22 = strlen(pcVar44), iVar18 <= (int)sVar22 + 1)) {
              pxVar25 = (xmlDocPtr)htmlReadMemory(pcVar44,iVar18,uVar41,uVar27,uVar40);
              if ((pxVar25 != (xmlDocPtr)0x0) && ((api_doc != pxVar25 && (pxVar25->doc != api_doc)))
                 ) {
                xmlFreeDoc();
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar18 = xmlMemBlocks();
              if (iVar17 != iVar18) {
                iVar18 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlReadMemory",(ulong)(uint)(iVar18 - iVar17));
                iVar15 = iVar15 + 1;
                printf(" %d",iVar16);
                printf(" %d",(ulong)uVar48);
                printf(" %d",uVar23);
                printf(" %d",(ulong)uVar34);
                printf(" %d",uVar28);
                putchar(10);
              }
            }
            uVar38 = (uint)uVar28 + 1;
            uVar28 = (ulong)uVar38;
            puVar43 = puVar43 + 1;
          } while (uVar38 != 4);
          uVar34 = uVar34 + 1;
        } while (uVar34 != 4);
        uVar34 = (uint)uVar23 + 1;
        uVar23 = (ulong)uVar34;
      } while (uVar34 != 8);
      uVar48 = uVar48 + 1;
    } while (uVar48 != 4);
    iVar16 = iVar16 + 1;
  } while (iVar16 != 4);
  function_tests = function_tests + 1;
  iVar16 = 0;
  uVar48 = 0;
  do {
    uVar23 = 0;
    do {
      iVar17 = 0;
      do {
        iVar18 = xmlMemBlocks();
        if (uVar48 < 4) {
          uVar41 = (&DAT_00165d70)[uVar48];
        }
        else {
          uVar41 = 0;
        }
        if ((uint)uVar23 < 3) {
          uVar27 = (&DAT_00165d58)[uVar23];
        }
        else {
          uVar27 = 0;
        }
        piVar47 = &call_tests;
        if (iVar17 != 0) {
          if (iVar17 == 1) {
            piVar47 = (int *)0xffffffffffffffff;
          }
          else {
            piVar47 = (int *)0x0;
          }
        }
        pxVar25 = (xmlDocPtr)htmlSAXParseDoc(uVar41,uVar27,0,piVar47);
        if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar19 = xmlMemBlocks();
        if (iVar18 != iVar19) {
          iVar19 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlSAXParseDoc",(ulong)(uint)(iVar19 - iVar18));
          iVar16 = iVar16 + 1;
          printf(" %d",(ulong)uVar48);
          printf(" %d",uVar23);
          printf(" %d",0);
          printf(" %d");
          putchar(10);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != 3);
      uVar34 = (uint)uVar23 + 1;
      uVar23 = (ulong)uVar34;
    } while (uVar34 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  iVar17 = 0;
  uVar48 = 0;
  do {
    uVar23 = 0;
    do {
      iVar18 = 0;
      do {
        iVar19 = xmlMemBlocks();
        if (uVar48 < 7) {
          uVar41 = (&DAT_00165d90)[uVar48];
        }
        else {
          uVar41 = 0;
        }
        if ((uint)uVar23 < 3) {
          uVar27 = (&DAT_00165d58)[uVar23];
        }
        else {
          uVar27 = 0;
        }
        piVar47 = &call_tests;
        if (iVar18 != 0) {
          if (iVar18 == 1) {
            piVar47 = (int *)0xffffffffffffffff;
          }
          else {
            piVar47 = (int *)0x0;
          }
        }
        pxVar25 = (xmlDocPtr)htmlSAXParseFile(uVar41,uVar27,0,piVar47);
        if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar20 = xmlMemBlocks();
        if (iVar19 != iVar20) {
          iVar20 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlSAXParseFile",(ulong)(uint)(iVar20 - iVar19));
          iVar17 = iVar17 + 1;
          printf(" %d",(ulong)uVar48);
          printf(" %d",uVar23);
          printf(" %d",0);
          printf(" %d");
          putchar(10);
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 != 3);
      uVar34 = (uint)uVar23 + 1;
      uVar23 = (ulong)uVar34;
    } while (uVar34 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 8);
  function_tests = function_tests + 1;
  uVar48 = iVar1 + iVar2 + iVar3 + local_60 + iVar5 + iVar39 + iVar33 + iVar4 + iVar6 + iVar8 +
           (uint)(iVar7 != iVar9) + iVar10 + iVar11 + local_58 + iVar12 + iVar13 + iVar14 + local_80
           + local_64 + local_68 + iVar15 + iVar16 + iVar17;
  if (uVar48 != 0) {
    printf("Module HTMLparser: %d errors\n",(ulong)uVar48);
  }
  return uVar48;
}

Assistant:

static int
test_HTMLparser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLparser : 32 of 38 functions ...\n");
    test_ret += test_UTF8ToHtml();
    test_ret += test_htmlAttrAllowed();
    test_ret += test_htmlAutoCloseTag();
    test_ret += test_htmlCreateMemoryParserCtxt();
    test_ret += test_htmlCreatePushParserCtxt();
    test_ret += test_htmlCtxtReadDoc();
    test_ret += test_htmlCtxtReadFile();
    test_ret += test_htmlCtxtReadMemory();
    test_ret += test_htmlCtxtReset();
    test_ret += test_htmlCtxtUseOptions();
    test_ret += test_htmlElementAllowedHere();
    test_ret += test_htmlElementStatusHere();
    test_ret += test_htmlEncodeEntities();
    test_ret += test_htmlEntityLookup();
    test_ret += test_htmlEntityValueLookup();
    test_ret += test_htmlHandleOmittedElem();
    test_ret += test_htmlIsAutoClosed();
    test_ret += test_htmlIsScriptAttribute();
    test_ret += test_htmlNewParserCtxt();
    test_ret += test_htmlNodeStatus();
    test_ret += test_htmlParseCharRef();
    test_ret += test_htmlParseChunk();
    test_ret += test_htmlParseDoc();
    test_ret += test_htmlParseDocument();
    test_ret += test_htmlParseElement();
    test_ret += test_htmlParseEntityRef();
    test_ret += test_htmlParseFile();
    test_ret += test_htmlReadDoc();
    test_ret += test_htmlReadFile();
    test_ret += test_htmlReadMemory();
    test_ret += test_htmlSAXParseDoc();
    test_ret += test_htmlSAXParseFile();
    test_ret += test_htmlTagLookup();

    if (test_ret != 0)
	printf("Module HTMLparser: %d errors\n", test_ret);
    return(test_ret);
}